

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

uint Catch::rngSeed(void)

{
  uint uVar1;
  undefined **ppuVar2;
  long *plVar3;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x20);
    ppuVar2 = &PTR__Context_001bac90;
    *IMutableContext::currentContext = &PTR__Context_001bac90;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
  }
  else {
    ppuVar2 = (undefined **)*IMutableContext::currentContext;
  }
  plVar3 = (long *)(*(code *)ppuVar2[4])();
  uVar1 = (**(code **)(*plVar3 + 0x88))(plVar3);
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }